

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O0

bool __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::readBasis(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,istream *is,NameSet *rowNames,NameSet *colNames)

{
  MPSInput *pMVar1;
  bool bVar2;
  type_conflict5 tVar3;
  byte bVar4;
  SPxStatus SVar5;
  int i_00;
  Status SVar6;
  int iVar7;
  int iVar8;
  Type TVar9;
  Section SVar10;
  ostream *poVar11;
  Status *pSVar12;
  ulong *puVar13;
  char *pcVar14;
  long in_RCX;
  MPSInput *in_RDX;
  istream *in_RSI;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  int r;
  int c;
  MPSInput mps;
  int i_2;
  int i_1;
  Desc l_desc;
  DataKey key_1;
  int i;
  stringstream name_1;
  int nRows;
  DataKey key;
  int j;
  stringstream name;
  int nCols;
  NameSet *p_rowNames;
  NameSet *p_colNames;
  NameSet *cNames;
  NameSet *rNames;
  undefined4 in_stack_fffffffffffff678;
  int in_stack_fffffffffffff67c;
  undefined7 in_stack_fffffffffffff680;
  undefined1 in_stack_fffffffffffff687;
  Type in_stack_fffffffffffff688;
  Type in_stack_fffffffffffff68c;
  Status in_stack_fffffffffffff690;
  Type in_stack_fffffffffffff694;
  undefined4 in_stack_fffffffffffff698;
  undefined4 in_stack_fffffffffffff69c;
  Desc *in_stack_fffffffffffff6a0;
  undefined4 in_stack_fffffffffffff6a8;
  undefined4 in_stack_fffffffffffff6ac;
  Real in_stack_fffffffffffff6b0;
  int in_stack_fffffffffffff6b8;
  int in_stack_fffffffffffff6bc;
  NameSet *in_stack_fffffffffffff6c0;
  char *in_stack_fffffffffffff6d0;
  undefined6 in_stack_fffffffffffff6d8;
  undefined1 in_stack_fffffffffffff6de;
  type_conflict5 tVar15;
  undefined1 in_stack_fffffffffffff6df;
  NameSet *in_stack_fffffffffffff6e0;
  MPSInput *in_stack_fffffffffffff718;
  long in_stack_fffffffffffff750;
  int local_8a0;
  MPSInput local_898;
  ulong local_538;
  undefined1 local_530 [56];
  undefined1 local_4f8 [56];
  ulong local_4c0;
  undefined1 local_4b8 [56];
  int local_480;
  int local_47c;
  DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
  local_478;
  DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
  local_460;
  string local_438 [32];
  DataKey local_418;
  DataKey local_410;
  int local_404;
  stringstream local_400 [16];
  ostream local_3f0 [380];
  int local_274;
  string local_270 [32];
  DataKey local_250;
  DataKey local_248;
  int local_240;
  stringstream local_230 [16];
  ostream local_220 [380];
  int local_a4;
  MPSInput *local_a0;
  long local_98;
  long local_90;
  MPSInput *local_88;
  long local_80;
  MPSInput *local_78;
  istream *local_70;
  undefined8 local_60;
  ulong *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined1 *local_38;
  undefined8 local_30;
  ulong *local_28;
  undefined1 *local_20;
  ulong *local_18;
  undefined8 local_10;
  ulong *local_8;
  
  local_98 = 0;
  local_a0 = (MPSInput *)0x0;
  local_90 = in_RCX;
  local_88 = in_RDX;
  local_80 = in_RCX;
  local_78 = in_RDX;
  local_70 = in_RSI;
  if (in_RCX == 0) {
    local_a4 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)0x2ff9bf);
    std::__cxx11::stringstream::stringstream(local_230);
    spx_alloc<soplex::NameSet*>((NameSet **)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc);
    NameSet::NameSet(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8,
                     in_stack_fffffffffffff6b0,
                     (Real)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
    in_stack_fffffffffffff750 = local_98;
    NameSet::reMax((NameSet *)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
                   in_stack_fffffffffffff67c);
    for (local_240 = 0; local_240 < local_a4; local_240 = local_240 + 1) {
      poVar11 = std::operator<<(local_220,"x");
      std::ostream::operator<<(poVar11,local_240);
      local_250 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ::colId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                                   0);
      local_248 = local_250;
      std::__cxx11::stringstream::str();
      std::__cxx11::string::c_str();
      NameSet::add(in_stack_fffffffffffff6e0,
                   (DataKey *)
                   CONCAT17(in_stack_fffffffffffff6df,
                            CONCAT16(in_stack_fffffffffffff6de,in_stack_fffffffffffff6d8)),
                   in_stack_fffffffffffff6d0);
      std::__cxx11::string::~string(local_270);
    }
    local_90 = local_98;
    std::__cxx11::stringstream::~stringstream(local_230);
  }
  if (local_88 == (MPSInput *)0x0) {
    local_274 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x2ffbc9);
    std::__cxx11::stringstream::stringstream(local_400);
    spx_alloc<soplex::NameSet*>((NameSet **)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc);
    pMVar1 = local_a0;
    NameSet::NameSet(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8,
                     in_stack_fffffffffffff6b0,
                     (Real)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
    local_a0 = pMVar1;
    NameSet::reMax((NameSet *)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
                   in_stack_fffffffffffff67c);
    for (local_404 = 0; local_404 < local_274; local_404 = local_404 + 1) {
      poVar11 = std::operator<<(local_3f0,"C");
      std::ostream::operator<<(poVar11,local_404);
      local_418 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ::rowId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                                   0);
      in_stack_fffffffffffff718 = local_a0;
      local_410 = local_418;
      std::__cxx11::stringstream::str();
      std::__cxx11::string::c_str();
      NameSet::add(in_stack_fffffffffffff6e0,
                   (DataKey *)
                   CONCAT17(in_stack_fffffffffffff6df,
                            CONCAT16(in_stack_fffffffffffff6de,in_stack_fffffffffffff6d8)),
                   in_stack_fffffffffffff6d0);
      std::__cxx11::string::~string(local_438);
    }
    local_88 = local_a0;
    std::__cxx11::stringstream::~stringstream(local_400);
  }
  SVar5 = status(in_RDI);
  if (SVar5 == NO_PROBLEM) {
    (*in_RDI->_vptr_SPxBasisBase[7])(in_RDI,in_RDI->theLP,0);
  }
  Desc::Desc(in_stack_fffffffffffff6a0,
             (Desc *)CONCAT44(in_stack_fffffffffffff69c,in_stack_fffffffffffff698));
  for (local_47c = 0; iVar8 = local_47c,
      i_00 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)0x2ffe1f), iVar8 < i_00; local_47c = local_47c + 1) {
    SVar6 = dualRowStatus(in_RDI,(int)((ulong)in_stack_fffffffffffff750 >> 0x20));
    pSVar12 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
              ::operator[](&local_478,local_47c);
    *pSVar12 = SVar6;
  }
  for (local_480 = 0; iVar8 = local_480,
      iVar7 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x2ffecd), iVar8 < iVar7; local_480 = local_480 + 1) {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
            in_stack_fffffffffffff67c);
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
            in_stack_fffffffffffff67c);
    bVar2 = boost::multiprecision::operator==
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x2fff3f);
    if (bVar2) {
      pSVar12 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                ::operator[](&local_460,local_480);
      *pSVar12 = P_FIXED;
    }
    else {
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
              in_stack_fffffffffffff67c);
      puVar13 = (ulong *)infinity();
      local_4c0 = *puVar13 ^ 0x8000000000000000;
      local_50 = local_4b8;
      local_58 = &local_4c0;
      local_60 = 0;
      local_8 = local_58;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
                 (double)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                 (type *)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680));
      tVar3 = boost::multiprecision::operator<=
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x30001d);
      tVar15 = false;
      if (tVar3) {
        SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
                in_stack_fffffffffffff67c);
        local_40 = infinity();
        local_38 = local_4f8;
        local_48 = 0;
        local_10 = local_40;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
                   (double)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                   (type *)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680));
        tVar15 = boost::multiprecision::operator>=
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)0x3000c2);
      }
      if (tVar15 == false) {
        SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
                in_stack_fffffffffffff67c);
        puVar13 = (ulong *)infinity();
        local_538 = *puVar13 ^ 0x8000000000000000;
        local_20 = local_530;
        local_28 = &local_538;
        local_30 = 0;
        local_18 = local_28;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
                   (double)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                   (type *)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680));
        tVar3 = boost::multiprecision::operator<=
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x3001aa);
        if (tVar3) {
          pSVar12 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                    ::operator[](&local_460,local_480);
          *pSVar12 = P_ON_UPPER;
        }
        else {
          pSVar12 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                    ::operator[](&local_460,local_480);
          *pSVar12 = P_ON_LOWER;
        }
      }
      else {
        pSVar12 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                  ::operator[](&local_460,local_480);
        *pSVar12 = P_FREE;
      }
    }
  }
  MPSInput::MPSInput(&local_898,local_70);
  bVar2 = MPSInput::readLine(in_stack_fffffffffffff718);
  if ((bVar2) && (pcVar14 = MPSInput::field0(&local_898), pcVar14 != (char *)0x0)) {
    pcVar14 = MPSInput::field0(&local_898);
    iVar8 = strcmp(pcVar14,"NAME");
    if (iVar8 == 0) {
      while (bVar2 = MPSInput::readLine(in_stack_fffffffffffff718), bVar2) {
        local_8a0 = -1;
        pcVar14 = MPSInput::field0(&local_898);
        if (pcVar14 != (char *)0x0) {
          pcVar14 = MPSInput::field0(&local_898);
          iVar8 = strcmp(pcVar14,"ENDATA");
          if (iVar8 == 0) {
            MPSInput::setSection(&local_898,ENDATA);
            break;
          }
        }
        pcVar14 = MPSInput::field1(&local_898);
        if ((pcVar14 == (char *)0x0) ||
           (pcVar14 = MPSInput::field2(&local_898), pcVar14 == (char *)0x0)) break;
        MPSInput::field2(&local_898);
        iVar8 = NameSet::number((NameSet *)
                                CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                                (char *)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680
                                                ));
        if (iVar8 < 0) break;
        pcVar14 = MPSInput::field1(&local_898);
        if (*pcVar14 == 'X') {
          pcVar14 = MPSInput::field3(&local_898);
          if (pcVar14 == (char *)0x0) break;
          MPSInput::field3(&local_898);
          local_8a0 = NameSet::number((NameSet *)
                                      CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                                      (char *)CONCAT17(in_stack_fffffffffffff687,
                                                       in_stack_fffffffffffff680));
          if (local_8a0 < 0) break;
        }
        pcVar14 = MPSInput::field1(&local_898);
        iVar7 = strcmp(pcVar14,"XU");
        if (iVar7 == 0) {
          SVar6 = dualColStatus(in_RDI,(int)((ulong)in_stack_fffffffffffff750 >> 0x20));
          pSVar12 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                    ::operator[](&local_460,iVar8);
          *pSVar12 = SVar6;
          TVar9 = LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::type((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)in_stack_fffffffffffff718,i_00);
          if (TVar9 == GREATER_EQUAL) {
            pSVar12 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                      ::operator[](&local_478,local_8a0);
            *pSVar12 = P_ON_LOWER;
          }
          else {
            in_stack_fffffffffffff694 =
                 LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::type((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)in_stack_fffffffffffff718,i_00);
            if (in_stack_fffffffffffff694 == EQUAL) {
              pSVar12 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                        ::operator[](&local_478,local_8a0);
              *pSVar12 = P_FIXED;
            }
            else {
              pSVar12 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                        ::operator[](&local_478,local_8a0);
              *pSVar12 = P_ON_UPPER;
            }
          }
        }
        else {
          pcVar14 = MPSInput::field1(&local_898);
          iVar7 = strcmp(pcVar14,"XL");
          if (iVar7 == 0) {
            in_stack_fffffffffffff690 =
                 dualColStatus(in_RDI,(int)((ulong)in_stack_fffffffffffff750 >> 0x20));
            pSVar12 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                      ::operator[](&local_460,iVar8);
            *pSVar12 = in_stack_fffffffffffff690;
            in_stack_fffffffffffff68c =
                 LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::type((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)in_stack_fffffffffffff718,i_00);
            if (in_stack_fffffffffffff68c == LESS_EQUAL) {
              pSVar12 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                        ::operator[](&local_478,local_8a0);
              *pSVar12 = P_ON_UPPER;
            }
            else {
              in_stack_fffffffffffff688 =
                   LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::type((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)in_stack_fffffffffffff718,i_00);
              if (in_stack_fffffffffffff688 == EQUAL) {
                pSVar12 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                          ::operator[](&local_478,local_8a0);
                *pSVar12 = P_FIXED;
              }
              else {
                pSVar12 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                          ::operator[](&local_478,local_8a0);
                *pSVar12 = P_ON_LOWER;
              }
            }
          }
          else {
            pcVar14 = MPSInput::field1(&local_898);
            iVar7 = strcmp(pcVar14,"UL");
            if (iVar7 == 0) {
              pSVar12 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                        ::operator[](&local_460,iVar8);
              *pSVar12 = P_ON_UPPER;
            }
            else {
              pcVar14 = MPSInput::field1(&local_898);
              iVar7 = strcmp(pcVar14,"LL");
              if (iVar7 != 0) {
                MPSInput::syntaxError
                          ((MPSInput *)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680)
                          );
                break;
              }
              pSVar12 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                        ::operator[](&local_460,iVar8);
              *pSVar12 = P_ON_LOWER;
            }
          }
        }
      }
    }
  }
  bVar2 = MPSInput::hasError(&local_898);
  if (!bVar2) {
    SVar10 = MPSInput::section(&local_898);
    if (SVar10 == ENDATA) {
      setStatus((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
                in_stack_fffffffffffff68c);
      (*in_RDI->_vptr_SPxBasisBase[5])(in_RDI,&local_478);
    }
    else {
      MPSInput::syntaxError
                ((MPSInput *)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680));
    }
  }
  if (local_78 == (MPSInput *)0x0) {
    NameSet::~NameSet((NameSet *)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680));
    spx_free<soplex::NameSet*>((NameSet **)0x300738);
  }
  if (local_80 == 0) {
    NameSet::~NameSet((NameSet *)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680));
    spx_free<soplex::NameSet*>((NameSet **)0x30075d);
  }
  bVar2 = MPSInput::hasError(&local_898);
  bVar4 = bVar2 ^ 0xff;
  MPSInput::~MPSInput(&local_898);
  Desc::~Desc((Desc *)CONCAT17(bVar4,in_stack_fffffffffffff680));
  return (bool)(bVar4 & 1);
}

Assistant:

bool SPxBasisBase<R>::readBasis(
   std::istream&  is,
   const NameSet* rowNames,
   const NameSet* colNames)
{
   assert(theLP != nullptr);

   /* prepare names */
   const NameSet* rNames = rowNames;
   const NameSet* cNames = colNames;

   NameSet* p_colNames = nullptr;
   NameSet* p_rowNames = nullptr;

   if(colNames == nullptr)
   {
      int nCols = theLP->nCols();
      std::stringstream name;

      spx_alloc(p_colNames);
      p_colNames = new(p_colNames) NameSet();
      p_colNames->reMax(nCols);

      for(int j = 0; j < nCols; ++j)
      {
         name << "x" << j;
         DataKey key = theLP->colId(j);
         p_colNames->add(key, name.str().c_str());
      }

      cNames = p_colNames;
   }

   if(rNames == nullptr)
   {
      int nRows = theLP->nRows();
      std::stringstream name;

      spx_alloc(p_rowNames);
      p_rowNames = new(p_rowNames) NameSet();
      p_rowNames->reMax(nRows);

      for(int i = 0; i < nRows; ++i)
      {
         name << "C" << i;
         DataKey key = theLP->rowId(i);
         p_rowNames->add(key, name.str().c_str());
      }

      rNames = p_rowNames;
   }

   /* load default basis if necessary */
   if(status() == NO_PROBLEM)
      load(theLP, false);

   /* initialize with standard settings */
   Desc l_desc(thedesc);

   for(int i = 0; i < theLP->nRows(); i++)
      l_desc.rowstat[i] = dualRowStatus(i);

   for(int i = 0; i < theLP->nCols(); i++)
   {
      if(theLP->SPxLPBase<R>::lower(i) == theLP->SPxLPBase<R>::upper(i))
         l_desc.colstat[i] = Desc::P_FIXED;
      else if(theLP->SPxLPBase<R>::lower(i) <= R(-infinity)
              && theLP->SPxLPBase<R>::upper(i) >= R(infinity))
         l_desc.colstat[i] = Desc::P_FREE;
      else if(theLP->SPxLPBase<R>::lower(i) <= R(-infinity))
         l_desc.colstat[i] = Desc::P_ON_UPPER;
      else
         l_desc.colstat[i] = Desc::P_ON_LOWER;
   }

   MPSInput mps(is);

   if(mps.readLine() && (mps.field0() != nullptr) && !strcmp(mps.field0(), "NAME"))
   {
      while(mps.readLine())
      {
         int c = -1;
         int r = -1;

         if((mps.field0() != nullptr) && !strcmp(mps.field0(), "ENDATA"))
         {
            mps.setSection(MPSInput::ENDATA);
            break;
         }

         if((mps.field1() == nullptr) || (mps.field2() == nullptr))
            break;

         if((c = cNames->number(mps.field2())) < 0)
            break;

         if(*mps.field1() == 'X')
            if(mps.field3() == nullptr || (r = rNames->number(mps.field3())) < 0)
               break;

         if(!strcmp(mps.field1(), "XU"))
         {
            l_desc.colstat[c] = dualColStatus(c);

            if(theLP->LPRowSetBase<R>::type(r) == LPRowBase<R>::GREATER_EQUAL)
               l_desc.rowstat[r] = Desc::P_ON_LOWER;
            else if(theLP->LPRowSetBase<R>::type(r) == LPRowBase<R>::EQUAL)
               l_desc.rowstat[r] = Desc::P_FIXED;
            else
               l_desc.rowstat[r] = Desc::P_ON_UPPER;
         }
         else if(!strcmp(mps.field1(), "XL"))
         {
            l_desc.colstat[c] = dualColStatus(c);

            if(theLP->LPRowSetBase<R>::type(r) == LPRowBase<R>::LESS_EQUAL)
               l_desc.rowstat[r] = Desc::P_ON_UPPER;
            else if(theLP->LPRowSetBase<R>::type(r) == LPRowBase<R>::EQUAL)
               l_desc.rowstat[r] = Desc::P_FIXED;
            else
               l_desc.rowstat[r] = Desc::P_ON_LOWER;
         }
         else if(!strcmp(mps.field1(), "UL"))
         {
            l_desc.colstat[c] = Desc::P_ON_UPPER;
         }
         else if(!strcmp(mps.field1(), "LL"))
         {
            l_desc.colstat[c] = Desc::P_ON_LOWER;
         }
         else
         {
            mps.syntaxError();
            break;
         }
      }
   }

   if(!mps.hasError())
   {
      if(mps.section() == MPSInput::ENDATA)
      {
         // force basis to be different from NO_PROBLEM
         // otherwise the basis will be overwritten at later stages.
         setStatus(REGULAR);
         loadDesc(l_desc);
      }
      else
         mps.syntaxError();
   }

   if(rowNames == nullptr)
   {
      p_rowNames->~NameSet();
      spx_free(p_rowNames);
   }

   if(colNames == nullptr)
   {
      p_colNames->~NameSet();
      spx_free(p_colNames);
   }

#ifndef NDEBUG
   SPX_DEBUG(thedesc.dump());
#endif

   return !mps.hasError();
}